

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agc.c
# Opt level: O2

int32_t DotProductWithScale(int16_t *vector1,int16_t *vector2,size_t length,int scaling)

{
  int iVar1;
  byte bVar2;
  ulong uVar3;
  
  iVar1 = 0;
  for (uVar3 = 3; bVar2 = (byte)scaling, uVar3 < length; uVar3 = uVar3 + 4) {
    iVar1 = ((int)vector2[uVar3] * (int)vector1[uVar3] >> (bVar2 & 0x1f)) +
            ((int)vector2[uVar3 - 1] * (int)vector1[uVar3 - 1] >> (bVar2 & 0x1f)) +
            ((int)vector2[uVar3 - 2] * (int)vector1[uVar3 - 2] >> (bVar2 & 0x1f)) +
            ((int)vector2[uVar3 - 3] * (int)vector1[uVar3 - 3] >> (bVar2 & 0x1f)) + iVar1;
  }
  for (uVar3 = uVar3 - 3; uVar3 < length; uVar3 = uVar3 + 1) {
    iVar1 = iVar1 + ((int)vector2[uVar3] * (int)vector1[uVar3] >> (bVar2 & 0x1f));
  }
  return iVar1;
}

Assistant:

int32_t DotProductWithScale(const int16_t *vector1, const int16_t *vector2, size_t length, int scaling) {
    int64_t sum = 0;
    size_t i = 0;

    /* Unroll the loop to improve performance. */
    for (i = 0; i + 3 < length; i += 4) {
        sum += (vector1[i + 0] * vector2[i + 0]) >> scaling;
        sum += (vector1[i + 1] * vector2[i + 1]) >> scaling;
        sum += (vector1[i + 2] * vector2[i + 2]) >> scaling;
        sum += (vector1[i + 3] * vector2[i + 3]) >> scaling;
    }
    for (; i < length; i++) {
        sum += (vector1[i] * vector2[i]) >> scaling;
    }

    return (int32_t) (sum);
}